

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void makeniche(level *lev,int trap_type)

{
  rm *aroom_00;
  level *plVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  trap *ptVar5;
  permonst *ptr;
  trap *ttmp;
  int yy;
  int xx;
  int dy;
  int vct;
  rm *rm;
  mkroom *aroom;
  level *plStack_10;
  int trap_type_local;
  level *lev_local;
  
  xx = 8;
  aroom._4_4_ = trap_type;
  plStack_10 = lev;
  if (lev->doorindex < 0x78) {
    do {
      plVar1 = plStack_10;
      if (xx == 0) {
        return;
      }
      xx = xx + -1;
      iVar3 = rn2(plStack_10->nroom);
      rm = (rm *)(plVar1->rooms + iVar3);
    } while ((rm->typ != '\0') ||
            (((rm->field_0x7 == '\x01' && (iVar3 = rn2(5), iVar3 != 0)) ||
             (bVar2 = place_niche(plStack_10,(mkroom *)rm,&yy,(int *)((long)&ttmp + 4),(int *)&ttmp)
             , bVar2 == '\0'))));
    _dy = plStack_10->locations[ttmp._4_4_] + ((int)ttmp + yy);
    if ((aroom._4_4_ == 0) && (iVar3 = rn2(4), iVar3 != 0)) {
      _dy->typ = '\x18';
      iVar3 = rn2(7);
      plVar1 = plStack_10;
      aroom_00 = rm;
      if (iVar3 == 0) {
        iVar3 = rn2(8);
        if (((iVar3 == 0) && (plStack_10->locations[ttmp._4_4_][(int)ttmp].typ != '\0')) &&
           (plStack_10->locations[ttmp._4_4_][(int)ttmp].typ < '\r')) {
          plStack_10->locations[ttmp._4_4_][(int)ttmp].typ = '\x16';
          iVar3 = rn2(3);
          if (iVar3 != 0) {
            ptr = mkclass(&plStack_10->z,'5',0);
            mkcorpstat(0x10e,(monst *)0x0,ptr,plStack_10,ttmp._4_4_,(int)ttmp + yy,'\x01');
          }
        }
        if ((*(uint *)&(plStack_10->flags).field_0x8 >> 0xb & 1) == 0) {
          mksobj_at(0x15c,plStack_10,ttmp._4_4_,(int)ttmp + yy,'\x01','\0');
        }
        iVar3 = rn2(3);
        if (iVar3 == 0) {
          mkobj_at('\0',plStack_10,ttmp._4_4_,(int)ttmp + yy,'\x01');
        }
      }
      else {
        iVar4 = rn2(5);
        iVar3 = 0x17;
        if (iVar4 != 0) {
          iVar3 = 0xf;
        }
        dosdoor(plVar1,(xchar)ttmp._4_4_,(xchar)(int)ttmp,(mkroom *)aroom_00,iVar3);
      }
    }
    else {
      _dy->typ = '\x10';
      if (aroom._4_4_ != 0) {
        if (((aroom._4_4_ == 0xd) || (aroom._4_4_ == 0xe)) &&
           (bVar2 = can_fall_thru(plStack_10), bVar2 == '\0')) {
          aroom._4_4_ = 3;
        }
        ptVar5 = maketrap(plStack_10,ttmp._4_4_,(int)ttmp + yy,aroom._4_4_);
        if (ptVar5 != (trap *)0x0) {
          if (aroom._4_4_ != 3) {
            ptVar5->field_0x8 = ptVar5->field_0x8 & 0xbf | 0x40;
          }
          if (trap_engravings[aroom._4_4_] != (char *)0x0) {
            make_engr_at(plStack_10,ttmp._4_4_,(int)ttmp - yy,trap_engravings[aroom._4_4_],0,'\x01')
            ;
            wipe_engr_at(plStack_10,(xchar)ttmp._4_4_,(char)(int)ttmp - (char)yy,'\x05');
          }
        }
      }
      dosdoor(plStack_10,(xchar)ttmp._4_4_,(xchar)(int)ttmp,(mkroom *)rm,0xf);
    }
  }
  return;
}

Assistant:

static void makeniche(struct level *lev, int trap_type)
{
	struct mkroom *aroom;
	struct rm *rm;
	int vct = 8;
	int dy, xx, yy;
	struct trap *ttmp;

	if (lev->doorindex < DOORMAX)
	  while (vct--) {
	    aroom = &lev->rooms[rn2(lev->nroom)];
	    if (aroom->rtype != OROOM) continue;	/* not an ordinary room */
	    if (aroom->doorct == 1 && rn2(5)) continue;
	    if (!place_niche(lev, aroom, &dy, &xx, &yy)) continue;

	    rm = &lev->locations[xx][yy+dy];
	    if (trap_type || !rn2(4)) {

		rm->typ = SCORR;
		if (trap_type) {
		    if ((trap_type == HOLE || trap_type == TRAPDOOR)
			&& !can_fall_thru(lev))
			trap_type = ROCKTRAP;
		    ttmp = maketrap(lev, xx, yy+dy, trap_type);
		    if (ttmp) {
			if (trap_type != ROCKTRAP) ttmp->once = 1;
			if (trap_engravings[trap_type]) {
			    make_engr_at(lev, xx, yy-dy,
				     trap_engravings[trap_type], 0L, DUST);
			    wipe_engr_at(lev, xx, yy-dy, 5); /* age it a little */
			}
		    }
		}
		dosdoor(lev, xx, yy, aroom, SDOOR);
	    } else {
		rm->typ = CORR;
		if (rn2(7)) {
		    dosdoor(lev, xx, yy, aroom, rn2(5) ? SDOOR : DOOR);
		} else {
		    /* inaccessible niches occasionally have iron bars */
		    if (!rn2(8) && IS_WALL(lev->locations[xx][yy].typ)) {
			lev->locations[xx][yy].typ = IRONBARS;
			if (rn2(3)) {
			    mkcorpstat(CORPSE, NULL, mkclass(&lev->z, S_HUMAN, 0),
				       lev, xx, yy + dy, TRUE);
			}
		    }
		    if (!lev->flags.noteleport)
			mksobj_at(SCR_TELEPORTATION, lev,
					 xx, yy+dy, TRUE, FALSE);
		    if (!rn2(3)) mkobj_at(0, lev, xx, yy+dy, TRUE);
		}
	    }
	    return;
	}
}